

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgt.cpp
# Opt level: O2

bool ReadMGT(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  char extraout_AL;
  bool bVar1;
  bool bVar2;
  int iVar3;
  string *path;
  Data *data;
  uint uVar4;
  array<unsigned_char,_2UL> buf;
  MGT_DISK_INFO di;
  array<unsigned_char,_512UL> sector0;
  undefined1 local_2a3 [3];
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  int local_278;
  undefined1 local_270 [576];
  FILE *pFVar5;
  
  pFVar5 = (FILE *)disk;
  iVar3 = MemFile::size(file);
  if (((iVar3 != 0xc8000) || (MemFile::rewind(file,pFVar5), extraout_AL == '\0')) ||
     (bVar1 = MemFile::read<std::array<unsigned_char,512ul>>
                        (file,(array<unsigned_char,_512UL> *)(local_270 + 0x40)), !bVar1)) {
    return false;
  }
  local_2a0._0_4_ = SAMDOS;
  local_2a0._4_4_ = 4;
  local_298._M_p = (pointer)&local_288;
  local_290 = 0;
  local_288._M_local_buf[0] = '\0';
  local_278 = 0;
  GetDiskInfo(local_270 + 0x40,(MGT_DISK_INFO *)local_2a0);
  bVar1 = MemFile::seek(file,local_2a0._4_4_ * 0x2800 | 0x1fe);
  if (bVar1) {
    bVar1 = MemFile::read<std::array<unsigned_char,2ul>>
                      (file,(array<unsigned_char,_2UL> *)local_2a3);
    if (!bVar1 || local_2a0._4_4_ != (uint)local_2a3[0]) goto LAB_00196e33;
    bVar1 = local_2a3[1] == '\x02';
    uVar4 = local_2a0._4_4_;
  }
  else {
LAB_00196e33:
    bVar1 = false;
    uVar4 = local_2a0._4_4_;
  }
  uVar4 = uVar4 * 0x1400 | 0x1fe;
  pFVar5 = (FILE *)(ulong)uVar4;
  bVar2 = MemFile::seek(file,uVar4);
  if (bVar2) {
    pFVar5 = (FILE *)local_2a3;
    bVar2 = MemFile::read<std::array<unsigned_char,2ul>>(file,(array<unsigned_char,_2UL> *)pFVar5);
    if ((!bVar2) || (local_2a0._4_4_ != (uint)local_2a3[0])) goto LAB_00196e74;
    bVar2 = local_2a3[1] == '\x02';
  }
  else {
LAB_00196e74:
    bVar2 = false;
  }
  if (!bVar1 && bVar2 == false) {
    path = MemFile::name_abi_cxx11_(file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_270,"mgt",(allocator<char> *)(local_2a3 + 2));
    pFVar5 = (FILE *)local_270;
    bVar1 = IsFileExt(path,(string *)pFVar5);
    std::__cxx11::string::~string((string *)local_270);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_00196f1a;
    }
  }
  MemFile::rewind(file,pFVar5);
  this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  Format::Format((Format *)local_270,MGT);
  data = MemFile::data(file);
  Disk::format(this,(Format *)local_270,data,bVar2);
  bVar1 = true;
  std::__cxx11::string::assign
            ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->strType
            );
LAB_00196f1a:
  std::__cxx11::string::~string((string *)&local_298);
  return bVar1;
}

Assistant:

bool ReadMGT(MemFile& file, std::shared_ptr<Disk>& disk)
{
    if (file.size() != MGT_DISK_SIZE)
        return false;

    // Read the first sector, which contains disk information.
    std::array<uint8_t, SECTOR_SIZE> sector0;
    if (!file.rewind() || !file.read(sector0))
        return false;

    MGT_DISK_INFO di{};
    GetDiskInfo(sector0.data(), di);

    // Check the expected chain offset in MGT images (alternating sides).
    std::array<uint8_t, 2> buf;
    auto offset = (di.dir_tracks * MGT_SIDES * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool mgt = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // Check the expected chain offset in IMG images (side 0 then side 1).
    offset = (di.dir_tracks * MGT_TRACK_SIZE) + SECTOR_SIZE - 2;
    bool img = file.seek(offset) && file.read(buf) && buf[0] == di.dir_tracks && buf[1] == 2;

    // If neither signature matched this probably isn't an MGT file.
    // However, accept it if it has a .mgt file extension.
    if (!mgt && !img && !IsFileExt(file.name(), "mgt"))
        return false;

    file.rewind();
    disk->format(Format(RegularFormat::MGT), file.data(), img);
    disk->strType = img ? "IMG" : "MGT";

    return true;
}